

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O0

ParseableFunctionInfo * __thiscall Js::FunctionProxy::GetParseableFunctionInfo(FunctionProxy *this)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  FunctionProxy *this_local;
  
  BVar3 = IsDeferredDeserializeFunction(this);
  if (BVar3 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                                ,0x592,"(!IsDeferredDeserializeFunction())",
                                "!IsDeferredDeserializeFunction()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  return (ParseableFunctionInfo *)this;
}

Assistant:

inline ParseableFunctionInfo* FunctionProxy::GetParseableFunctionInfo() const
    {
        Assert(!IsDeferredDeserializeFunction());
        return (ParseableFunctionInfo*)this;
    }